

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O1

long __thiscall AmsRouter::AddRoute(AmsRouter *this,AmsNetId ams,string *host)

{
  map<AmsNetId,_std::tuple<>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
  *this_00;
  long *plVar1;
  mapped_type pAVar2;
  AmsRouter *__router;
  bool bVar3;
  AmsConnection *pAVar4;
  mapped_type *ppAVar5;
  _Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>
  _Var6;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::_Rb_tree_iterator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
  pVar9;
  pair<std::__detail::_Node_iterator<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_true,_false>,_bool>
  pVar10;
  AddressList hostAddresses;
  unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_> new_connection;
  unique_lock<std::recursive_mutex> lock;
  AmsNetId local_80;
  code *local_78;
  addrinfo *local_70;
  AmsRouter *local_68;
  AmsConnection *local_60;
  AmsNetId local_56;
  undefined1 local_50 [16];
  char local_40 [16];
  
  local_80.b._0_4_ = ams.b._0_4_;
  local_80.b._4_2_ = ams.b._4_2_;
  local_50._0_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"48898","");
  bhf::ads::GetListOfAddresses((ads *)&local_78,host,(string *)local_50);
  if ((char *)local_50._0_8_ != local_40) {
    operator_delete((void *)local_50._0_8_);
  }
  local_50._0_8_ = &this->mutex;
  local_50[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_50);
  local_50[8] = true;
  AwaitConnectionAttempts(this,&local_80,(unique_lock<std::recursive_mutex> *)local_50);
  pAVar4 = GetConnection(this,&local_80);
  if (pAVar4 != (AmsConnection *)0x0) {
    bVar3 = AmsConnection::IsConnectedTo(pAVar4,local_70);
    uVar8 = 0x506;
    if (!bVar3) goto LAB_0012bc80;
  }
  p_Var7 = (this->connections)._M_h._M_before_begin._M_nxt;
  local_68 = this;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    uVar8 = 0;
    do {
      bVar3 = AmsConnection::IsConnectedTo((AmsConnection *)p_Var7[1]._M_nxt,local_70);
      if (bVar3) {
        LOCK();
        p_Var7[1]._M_nxt[0x15]._M_nxt =
             (_Hash_node_base *)((long)&(p_Var7[1]._M_nxt[0x15]._M_nxt)->_M_nxt + 1);
        UNLOCK();
        pAVar2 = (mapped_type)p_Var7[1]._M_nxt;
        ppAVar5 = std::
                  map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
                  ::operator[](&this->mapping,&local_80);
        *ppAVar5 = pAVar2;
        if (bVar3) goto LAB_0012bc80;
      }
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  __router = local_68;
  this_00 = &local_68->connection_attempts;
  std::
  map<AmsNetId,_std::tuple<>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
  ::operator[](this_00,&local_80);
  std::unique_lock<std::recursive_mutex>::unlock((unique_lock<std::recursive_mutex> *)local_50);
  pAVar4 = (AmsConnection *)operator_new(0x3918);
  AmsConnection::AmsConnection(pAVar4,&__router->super_Router,local_70);
  local_60 = pAVar4;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_50);
  pVar9 = std::
          _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_std::tuple<>_>,_std::_Select1st<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
          ::equal_range(&this_00->_M_t,&local_80);
  std::
  _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_std::tuple<>_>,_std::_Select1st<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
  std::_V2::condition_variable_any::notify_all(&__router->connection_attempt_events);
  pVar10 = std::
           _Hashtable<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::allocator<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::hash<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           ::_M_emplace<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>
                     ((_Hashtable<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>,std::allocator<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::hash<std::unique_ptr<AmsConnection,std::default_delete<AmsConnection>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)&__router->connections,&local_60);
  _Var6 = pVar10.first.
          super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
          ._M_cur;
  uVar8 = 0xffffffffffffffff;
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    bVar3 = AmsNetId::operator_cast_to_bool(&__router->localAddr);
    if (!bVar3) {
      AmsNetId::AmsNetId(&local_56,
                         *(uint32_t *)
                          (*(long *)((long)_Var6.
                                           super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                                           ._M_cur + 8) + 0x3910));
      *(undefined2 *)((__router->localAddr).b + 4) = local_56.b._4_2_;
      *(undefined4 *)(__router->localAddr).b = local_56.b._0_4_;
    }
    LOCK();
    plVar1 = (long *)(*(long *)((long)_Var6.
                                      super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                                      ._M_cur + 8) + 0xa8);
    *plVar1 = *plVar1 + 1;
    UNLOCK();
    pAVar2 = *(mapped_type *)
              ((long)_Var6.
                     super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                     ._M_cur + 8);
    ppAVar5 = std::
              map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
              ::operator[](&__router->mapping,&local_80);
    *ppAVar5 = pAVar2;
    uVar8 = (ulong)(*(int *)(*(long *)((long)_Var6.
                                             super__Node_iterator_base<std::unique_ptr<AmsConnection,_std::default_delete<AmsConnection>_>,_false>
                                             ._M_cur + 8) + 0x3910) == 0);
  }
  pAVar4 = local_60;
  if (local_60 != (AmsConnection *)0x0) {
    AmsConnection::~AmsConnection(local_60);
    operator_delete(pAVar4);
  }
LAB_0012bc80:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_50);
  if (local_70 != (addrinfo *)0x0) {
    (*local_78)();
  }
  return uVar8;
}

Assistant:

long AmsRouter::AddRoute(AmsNetId ams, const std::string& host)
{
    /**
        DNS lookups are pretty time consuming, we shouldn't do them
        with a looked mutex! So instead we do the lookup first and
        use the results, later.
     */
    auto hostAddresses = bhf::ads::GetListOfAddresses(host, "48898");

    std::unique_lock<std::recursive_mutex> lock(mutex);

    AwaitConnectionAttempts(ams, lock);

    const auto oldConnection = GetConnection(ams);
    if (oldConnection && !oldConnection->IsConnectedTo(hostAddresses.get())) {
        /**
           There is already a route for this AmsNetId, but with
           a different IP. The old route has to be deleted, first!
         */
        return ROUTERERR_PORTALREADYINUSE;
    }

    for (const auto& conn : connections) {
        if (conn->IsConnectedTo(hostAddresses.get())) {
            conn->refCount++;
            mapping[ams] = conn.get();
            return 0;
        }
    }

    connection_attempts[ams] = {};
    lock.unlock();

    try {
        auto new_connection = std::unique_ptr<AmsConnection>(new AmsConnection { *this, hostAddresses.get()});
        lock.lock();
        connection_attempts.erase(ams);
        connection_attempt_events.notify_all();

        auto conn = connections.emplace(std::move(new_connection));
        if (conn.second) {
            /** in case no local AmsNetId was set previously, we derive one */
            if (!localAddr) {
                localAddr = AmsNetId {conn.first->get()->ownIp};
            }
            conn.first->get()->refCount++;
            mapping[ams] = conn.first->get();
            return !conn.first->get()->ownIp;
        }

        return -1;
    } catch (std::exception& e) {
        lock.lock();
        connection_attempts.erase(ams);
        connection_attempt_events.notify_all();
        throw e;
    }
}